

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O3

string * readable_size_abi_cxx11_(string *__return_storage_ptr__,uint64_t size)

{
  size_t sVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  char *__s;
  char FILE_SIZE_UNITS [8] [3];
  ostringstream out;
  char *local_1d8;
  long local_1d0;
  char local_1c8 [16];
  char local_1b8 [24];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  local_1b8[0] = 'B';
  local_1b8[1] = ' ';
  local_1b8[2] = '\0';
  local_1b8[3] = 'K';
  local_1b8[4] = 'B';
  local_1b8[5] = '\0';
  local_1b8[6] = 'M';
  local_1b8[7] = 'B';
  local_1b8[8] = '\0';
  local_1b8[9] = 'G';
  local_1b8[10] = 'B';
  local_1b8[0xb] = '\0';
  local_1b8[0xc] = 'T';
  local_1b8[0xd] = 'B';
  local_1b8[0xe] = '\0';
  local_1b8[0xf] = 'P';
  local_1b8[0x10] = 'B';
  local_1b8[0x11] = '\0';
  local_1b8[0x12] = 'E';
  local_1b8[0x13] = 'B';
  local_1b8[0x14] = '\0';
  local_1b8[0x15] = 'Z';
  local_1b8[0x16] = 'B';
  local_1b8[0x17] = '\0';
  if (size < 0x400) {
    uVar3 = 0;
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    do {
      uVar4 = size;
      lVar2 = lVar2 + 1;
      size = uVar4 >> 10;
    } while (0xfffff < uVar4);
    uVar3 = (uint)uVar4 & 0x3ff;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"",0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  if (99 < uVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".",1);
    std::ostream::operator<<((ostream *)local_1a0,uVar3 / 100);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," ",1);
  __s = local_1b8 + lVar2 * 3;
  local_1d8 = local_1c8;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,__s,__s + sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,local_1d8,local_1d0);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string readable_size(uint64_t size)
{
    constexpr const char FILE_SIZE_UNITS[8][3]{"B ", "KB", "MB", "GB", "TB", "PB", "EB", "ZB"};
    uint64_t s = size, r = 0;
    int idx = 0;
    while (s / 1024 > 0)
    {
        r = s % 1024;
        s = s / 1024;
        idx++;
    }
    int point = (int)(r / 100);
    std::ostringstream out;
    out << "" << s;
    if (point != 0)
        out << "." << point;
    out << " " << std::string(FILE_SIZE_UNITS[idx]);
    return out.str();
}